

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Echo.cpp
# Opt level: O0

void __thiscall
helics::apps::Echo::addEndpoint(Echo *this,string_view endpointName,string_view endpointType)

{
  string_view type;
  string_view eptName;
  reference this_00;
  anon_class_8_1_8991fb9c *in_RDI;
  Endpoint *in_stack_ffffffffffffff58;
  deque<helics::Endpoint,_std::allocator<helics::Endpoint>_> *this_01;
  MessageFederate *in_stack_ffffffffffffff70;
  size_t in_stack_ffffffffffffff78;
  char *in_stack_ffffffffffffff80;
  size_t in_stack_ffffffffffffff88;
  char *in_stack_ffffffffffffff90;
  function<void_(const_helics::Endpoint_&,_TimeRepresentation<count_time<9,_long>_>)>
  *in_stack_ffffffffffffff98;
  Endpoint *in_stack_ffffffffffffffa0;
  
  this_01 = (deque<helics::Endpoint,_std::allocator<helics::Endpoint>_> *)(in_RDI + 0x14);
  CLI::std::
  __shared_ptr_access<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x405ea3);
  eptName._M_str = in_stack_ffffffffffffff90;
  eptName._M_len = in_stack_ffffffffffffff88;
  type._M_str = in_stack_ffffffffffffff80;
  type._M_len = in_stack_ffffffffffffff78;
  helics::MessageFederate::registerGlobalEndpoint(in_stack_ffffffffffffff70,eptName,type);
  std::deque<helics::Endpoint,std::allocator<helics::Endpoint>>::emplace_back<helics::Endpoint&>
            (this_01,in_stack_ffffffffffffff58);
  this_00 = CLI::std::deque<helics::Endpoint,_std::allocator<helics::Endpoint>_>::back
                      ((deque<helics::Endpoint,_std::allocator<helics::Endpoint>_> *)
                       in_stack_ffffffffffffff70);
  std::function<void(helics::Endpoint_const&,TimeRepresentation<count_time<9,long>>)>::
  function<helics::apps::Echo::addEndpoint(std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>)::__0,void>
            ((function<void_(const_helics::Endpoint_&,_TimeRepresentation<count_time<9,_long>_>)> *)
             this_00,in_RDI);
  Endpoint::setCallback(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  std::function<void_(const_helics::Endpoint_&,_TimeRepresentation<count_time<9,_long>_>)>::
  ~function((function<void_(const_helics::Endpoint_&,_TimeRepresentation<count_time<9,_long>_>)> *)
            0x405f35);
  return;
}

Assistant:

void Echo::addEndpoint(std::string_view endpointName, std::string_view endpointType)
    {
        endpoints.emplace_back(fed->registerGlobalEndpoint(endpointName, endpointType));
        endpoints.back().setCallback(
            [this](const Endpoint& ept, Time messageTime) { echoMessage(ept, messageTime); });
    }